

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::TraverseSchema::isSubstitutionGroupCircular
          (TraverseSchema *this,SchemaElementDecl *elemDecl,SchemaElementDecl *subsElemDecl)

{
  if (elemDecl == subsElemDecl) {
    return true;
  }
  do {
    subsElemDecl = subsElemDecl->fSubstitutionGroupElem;
    if (subsElemDecl == elemDecl) {
      return subsElemDecl != (SchemaElementDecl *)0x0;
    }
  } while (subsElemDecl != (SchemaElementDecl *)0x0);
  return subsElemDecl != (SchemaElementDecl *)0x0;
}

Assistant:

bool TraverseSchema::isSubstitutionGroupCircular(SchemaElementDecl* const elemDecl,
                                                 SchemaElementDecl* const subsElemDecl)
{

    if (elemDecl == subsElemDecl)
        return true;

    SchemaElementDecl* tmpElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (tmpElemDecl)
    {
        if (tmpElemDecl == elemDecl)
            return true;

        tmpElemDecl = tmpElemDecl->getSubstitutionGroupElem();
    }

    return false;
}